

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynhds.c
# Opt level: O1

CURLcode Curl_dynhds_add(dynhds *dynhds,char *name,size_t namelen,char *value,size_t valuelen)

{
  uint uVar1;
  ulong uVar2;
  size_t sVar3;
  dynhds_entry *pdVar4;
  ulong uVar5;
  dynhds_entry **__dest;
  CURLcode CVar6;
  char *__dest_00;
  ulong uVar7;
  
  if ((dynhds->max_entries != 0) && (dynhds->max_entries <= dynhds->hds_len)) {
    return CURLE_OUT_OF_MEMORY;
  }
  if (dynhds->max_strs_size < dynhds->strs_len + valuelen + namelen) {
    return CURLE_OUT_OF_MEMORY;
  }
  uVar1 = dynhds->opts;
  pdVar4 = (dynhds_entry *)(*Curl_ccalloc)(1,valuelen + namelen + 0x22);
  if (pdVar4 == (dynhds_entry *)0x0) {
    pdVar4 = (dynhds_entry *)0x0;
  }
  else {
    pdVar4->name = (char *)(pdVar4 + 1);
    memcpy(pdVar4 + 1,name,namelen);
    pdVar4->namelen = namelen;
    __dest_00 = (char *)((long)&pdVar4[1].name + namelen + 1);
    pdVar4->value = __dest_00;
    memcpy(__dest_00,value,valuelen);
    pdVar4->valuelen = valuelen;
    if ((uVar1 & 1) != 0) {
      Curl_strntolower(pdVar4->name,pdVar4->name,pdVar4->namelen);
    }
  }
  CVar6 = CURLE_OUT_OF_MEMORY;
  if (pdVar4 == (dynhds_entry *)0x0) {
    pdVar4 = (dynhds_entry *)0x0;
    goto LAB_00126f46;
  }
  if (dynhds->hds_allc <= dynhds->hds_len + 1) {
    uVar5 = dynhds->hds_len + 0x10;
    uVar2 = dynhds->max_entries;
    uVar7 = uVar2;
    if (uVar5 < uVar2) {
      uVar7 = uVar5;
    }
    if (uVar2 == 0) {
      uVar7 = uVar5;
    }
    __dest = (dynhds_entry **)(*Curl_ccalloc)(uVar7,8);
    if (__dest == (dynhds_entry **)0x0) goto LAB_00126f46;
    if (dynhds->hds != (dynhds_entry **)0x0) {
      memcpy(__dest,dynhds->hds,dynhds->hds_len << 3);
      (*Curl_cfree)(dynhds->hds);
      dynhds->hds = (dynhds_entry **)0x0;
    }
    dynhds->hds = __dest;
    dynhds->hds_allc = uVar7;
    if (__dest == (dynhds_entry **)0x0) goto LAB_00126f46;
  }
  sVar3 = dynhds->hds_len;
  dynhds->hds_len = sVar3 + 1;
  dynhds->hds[sVar3] = pdVar4;
  dynhds->strs_len = dynhds->strs_len + valuelen + namelen;
  pdVar4 = (dynhds_entry *)0x0;
  CVar6 = CURLE_OK;
LAB_00126f46:
  if (pdVar4 != (dynhds_entry *)0x0) {
    (*Curl_cfree)(pdVar4);
  }
  return CVar6;
}

Assistant:

CURLcode Curl_dynhds_add(struct dynhds *dynhds,
                         const char *name, size_t namelen,
                         const char *value, size_t valuelen)
{
  struct dynhds_entry *entry = NULL;
  CURLcode result = CURLE_OUT_OF_MEMORY;

  DEBUGASSERT(dynhds);
  if(dynhds->max_entries && dynhds->hds_len >= dynhds->max_entries)
    return CURLE_OUT_OF_MEMORY;
  if(dynhds->strs_len + namelen + valuelen > dynhds->max_strs_size)
    return CURLE_OUT_OF_MEMORY;

entry = entry_new(name, namelen, value, valuelen, dynhds->opts);
  if(!entry)
    goto out;

  if(dynhds->hds_len + 1 >= dynhds->hds_allc) {
    size_t nallc = dynhds->hds_len + 16;
    struct dynhds_entry **nhds;

    if(dynhds->max_entries && nallc > dynhds->max_entries)
      nallc = dynhds->max_entries;

    nhds = calloc(nallc, sizeof(struct dynhds_entry *));
    if(!nhds)
      goto out;
    if(dynhds->hds) {
      memcpy(nhds, dynhds->hds,
             dynhds->hds_len * sizeof(struct dynhds_entry *));
      Curl_safefree(dynhds->hds);
    }
    dynhds->hds = nhds;
    dynhds->hds_allc = nallc;
  }
  dynhds->hds[dynhds->hds_len++] = entry;
  entry = NULL;
  dynhds->strs_len += namelen + valuelen;
  result = CURLE_OK;

out:
  if(entry)
    entry_free(entry);
  return result;
}